

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

MacroArgumentDefaultSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MacroArgumentDefaultSyntax,slang::parsing::Token&,slang::syntax::TokenList_const&>
          (BumpAllocator *this,Token *args,TokenList *args_1)

{
  Token equals;
  MacroArgumentDefaultSyntax *this_00;
  
  this_00 = (MacroArgumentDefaultSyntax *)allocate(this,0x50,8);
  equals.kind = args->kind;
  equals._2_1_ = args->field_0x2;
  equals.numFlags.raw = (args->numFlags).raw;
  equals.rawLen = args->rawLen;
  equals.info = args->info;
  slang::syntax::MacroArgumentDefaultSyntax::MacroArgumentDefaultSyntax(this_00,equals,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }